

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Helper.cpp
# Opt level: O2

void adios2::format::BP5Helper::GathervArraysTwoLevel
               (Comm *groupComm,Comm *groupLeaderComm,JSONProfiler *Profiler,uint64_t *MyContrib,
               size_t LocalSize,size_t *OverallRecvCounts,size_t OverallRecvCountsSize,
               uint64_t *OverallRecvBuffer,size_t DestRank)

{
  int iVar1;
  unsigned_long *n;
  pointer puVar2;
  ostream *poVar3;
  size_type __new_size;
  long lVar4;
  unsigned_long source;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvBuffer;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_188;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"ES_meta1",(allocator *)&local_168);
  profiling::JSONProfiler::Start(Profiler,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_168._M_impl.super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_168._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = helper::Comm::Size(groupComm);
  if (1 < iVar1) {
    std::__cxx11::string::string((string *)&local_70,"ES_meta1_gather",(allocator *)&local_188);
    profiling::JSONProfiler::Start(Profiler,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    helper::Comm::GatherValues<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,groupComm,
               LocalSize,0);
    iVar1 = helper::Comm::Rank(groupComm);
    if (iVar1 == 0) {
      __new_size = 0;
      for (puVar2 = local_188._M_impl.super__Vector_impl_data._M_start;
          puVar2 != local_188._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
        __new_size = __new_size + *puVar2;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168,__new_size);
    }
    helper::Comm::GathervArrays<unsigned_long>
              (groupComm,MyContrib,LocalSize,local_188._M_impl.super__Vector_impl_data._M_start,
               (long)local_188._M_impl.super__Vector_impl_data._M_finish -
               (long)local_188._M_impl.super__Vector_impl_data._M_start >> 3,
               local_168._M_impl.super__Vector_impl_data._M_start,0);
    std::__cxx11::string::string((string *)&local_90,"ES_meta1_gather",(allocator *)&local_148);
    profiling::JSONProfiler::Stop(Profiler,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_188);
  }
  std::__cxx11::string::string((string *)&local_b0,"ES_meta1",(allocator *)&local_188);
  profiling::JSONProfiler::Stop(Profiler,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"ES_meta2",(allocator *)&local_188);
  profiling::JSONProfiler::Start(Profiler,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  iVar1 = helper::Comm::Rank(groupComm);
  if (iVar1 == 0) {
    local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_start = (size_t *)0x0;
    local_188._M_impl.super__Vector_impl_data._M_finish = (size_t *)0x0;
    lVar4 = (long)local_168._M_impl.super__Vector_impl_data._M_finish -
            (long)local_168._M_impl.super__Vector_impl_data._M_start;
    iVar1 = helper::Comm::Size(groupLeaderComm);
    if (iVar1 < 2) {
      poVar3 = std::operator<<((ostream *)&std::cout,"This should never happen");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      std::__cxx11::string::string((string *)&local_f0,"ES_meta2_gather",(allocator *)&local_148);
      profiling::JSONProfiler::Start(Profiler,&local_f0);
      source = lVar4 >> 3;
      std::__cxx11::string::~string((string *)&local_f0);
      helper::Comm::GatherValues<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_148,groupLeaderComm
                 ,source,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,&local_148);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_148);
      helper::Comm::GathervArrays<unsigned_long>
                (groupLeaderComm,local_168._M_impl.super__Vector_impl_data._M_start,source,
                 local_188._M_impl.super__Vector_impl_data._M_start,
                 (long)local_188._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_188._M_impl.super__Vector_impl_data._M_start >> 3,OverallRecvBuffer,0);
      std::__cxx11::string::string((string *)&local_110,"ES_meta2_gather",(allocator *)&local_148);
      profiling::JSONProfiler::Stop(Profiler,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_188);
  }
  std::__cxx11::string::string((string *)&local_130,"ES_meta2",(allocator *)&local_188);
  profiling::JSONProfiler::Stop(Profiler,&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_168);
  return;
}

Assistant:

void BP5Helper::GathervArraysTwoLevel(helper::Comm &groupComm, helper::Comm &groupLeaderComm,
                                      adios2::profiling::JSONProfiler &Profiler,
                                      uint64_t *MyContrib, size_t LocalSize,
                                      size_t *OverallRecvCounts, size_t OverallRecvCountsSize,
                                      uint64_t *OverallRecvBuffer, size_t DestRank)
{
    /*
     * Two-step aggregation of data that requires no intermediate processing
     */
    Profiler.Start("ES_meta1");
    std::vector<uint64_t> RecvBuffer;
    if (groupComm.Size() > 1)
    { // level 1
        Profiler.Start("ES_meta1_gather");
        std::vector<size_t> RecvCounts = groupComm.GatherValues(LocalSize, 0);
        if (groupComm.Rank() == 0)
        {
            uint64_t TotalSize = 0;
            for (auto &n : RecvCounts)
                TotalSize += n;
            RecvBuffer.resize(TotalSize);
            /*std::cout << "MD Lvl-1: rank " << m_Comm.Rank() << " gather "
                      << TotalSize << " bytes from aggregator group"
                      << std::endl;*/
        }
        groupComm.GathervArrays(MyContrib, LocalSize, RecvCounts.data(), RecvCounts.size(),
                                RecvBuffer.data(), 0);
        Profiler.Stop("ES_meta1_gather");
    } // level 1
    Profiler.Stop("ES_meta1");
    Profiler.Start("ES_meta2");
    // level 2
    if (groupComm.Rank() == 0)
    {
        std::vector<size_t> RecvCounts;
        size_t LocalSize = RecvBuffer.size();
        if (groupLeaderComm.Size() > 1)
        {
            Profiler.Start("ES_meta2_gather");
            RecvCounts = groupLeaderComm.GatherValues(LocalSize, 0);
            groupLeaderComm.GathervArrays(RecvBuffer.data(), LocalSize, RecvCounts.data(),
                                          RecvCounts.size(), OverallRecvBuffer, 0);
            Profiler.Stop("ES_meta2_gather");
        }
        else
        {
            std::cout << "This should never happen" << std::endl;
        }
    } // level 2
    Profiler.Stop("ES_meta2");
}